

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceObjectBase.hpp
# Opt level: O1

void __thiscall
Diligent::
DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceGLImpl,_Diligent::PipelineResourceSignatureDesc>
::DeviceObjectBase(DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceGLImpl,_Diligent::PipelineResourceSignatureDesc>
                   *this,IReferenceCounters *pRefCounters,RenderDeviceGLImpl *pDevice,
                  PipelineResourceSignatureDesc *ObjDesc,bool bIsDeviceInternal)

{
  atomic<int> *paVar1;
  RenderDeviceGLImpl *pRVar2;
  PipelineResourceDesc *pPVar3;
  ImmutableSamplerDesc *pIVar4;
  Char *pCVar5;
  Uint32 UVar6;
  undefined4 uVar7;
  Uint32 UVar8;
  Uint8 UVar9;
  Bool BVar10;
  undefined2 uVar11;
  int iVar12;
  size_t sVar13;
  IMemoryAllocator *pIVar14;
  char *pcVar15;
  undefined4 extraout_var_00;
  PipelineResourceSignatureDesc *Args_1;
  string msg;
  string local_48;
  undefined4 extraout_var;
  
  Args_1 = ObjDesc;
  RefCountedObject<Diligent::IPipelineResourceSignature>::RefCountedObject<>
            ((RefCountedObject<Diligent::IPipelineResourceSignature> *)this,pRefCounters);
  (this->super_ObjectBase<Diligent::IPipelineResourceSignature>).
  super_RefCountedObject<Diligent::IPipelineResourceSignature>.super_IPipelineResourceSignature.
  super_IDeviceObject.super_IObject._vptr_IObject = (_func_int **)&PTR_QueryInterface_00b04638;
  this->m_pDevice = pDevice;
  pPVar3 = ObjDesc->Resources;
  UVar6 = ObjDesc->NumResources;
  uVar7 = *(undefined4 *)&ObjDesc->field_0x14;
  pIVar4 = ObjDesc->ImmutableSamplers;
  UVar8 = ObjDesc->NumImmutableSamplers;
  UVar9 = ObjDesc->BindingIndex;
  BVar10 = ObjDesc->UseCombinedTextureSamplers;
  uVar11 = *(undefined2 *)&ObjDesc->field_0x26;
  pCVar5 = ObjDesc->CombinedSamplerSuffix;
  (this->m_Desc).super_DeviceObjectAttribs.Name = (ObjDesc->super_DeviceObjectAttribs).Name;
  (this->m_Desc).Resources = pPVar3;
  (this->m_Desc).NumResources = UVar6;
  *(undefined4 *)&(this->m_Desc).field_0x14 = uVar7;
  (this->m_Desc).ImmutableSamplers = pIVar4;
  (this->m_Desc).NumImmutableSamplers = UVar8;
  (this->m_Desc).BindingIndex = UVar9;
  (this->m_Desc).UseCombinedTextureSamplers = BVar10;
  *(undefined2 *)&(this->m_Desc).field_0x26 = uVar11;
  (this->m_Desc).CombinedSamplerSuffix = pCVar5;
  uVar7 = *(undefined4 *)&ObjDesc->field_0x34;
  (this->m_Desc).SRBAllocationGranularity = ObjDesc->SRBAllocationGranularity;
  *(undefined4 *)&(this->m_Desc).field_0x34 = uVar7;
  if (pDevice == (RenderDeviceGLImpl *)0x0) {
    iVar12 = 0;
  }
  else {
    LOCK();
    paVar1 = &(pDevice->super_RenderDeviceBase<Diligent::EngineGLImplTraits>).m_UniqueId;
    iVar12 = (paVar1->super___atomic_base<int>)._M_i;
    (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + 1;
    UNLOCK();
    iVar12 = iVar12 + 1;
  }
  this->m_UniqueID = iVar12;
  this->m_bIsDeviceInternal = bIsDeviceInternal;
  (this->m_pUserData).m_pObject = (IObject *)0x0;
  if (!bIsDeviceInternal) {
    if (this->m_pDevice == (RenderDeviceGLImpl *)0x0) {
      FormatString<char[26],char[21]>
                (&local_48,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"m_pDevice != nullptr",(char (*) [21])Args_1);
      Args_1 = (PipelineResourceSignatureDesc *)0x47;
      DebugAssertionFailed
                (local_48._M_dataplus._M_p,"DeviceObjectBase",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceObjectBase.hpp"
                 ,0x47);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      }
    }
    pRVar2 = this->m_pDevice;
    if ((pRVar2->super_RenderDeviceBase<Diligent::EngineGLImplTraits>).
        super_ObjectBase<Diligent::IRenderDeviceGL>.
        super_RefCountedObject<Diligent::IRenderDeviceGL>.m_pRefCounters == (RefCountersImpl *)0x0)
    {
      FormatString<char[26],char[26]>
                (&local_48,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"m_pRefCounters != nullptr",(char (*) [26])Args_1);
      DebugAssertionFailed
                (local_48._M_dataplus._M_p,"AddRef",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/RefCountedObjectImpl.hpp"
                 ,0x221);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      }
    }
    RefCountersImpl::AddStrongRef
              ((pRVar2->super_RenderDeviceBase<Diligent::EngineGLImplTraits>).
               super_ObjectBase<Diligent::IRenderDeviceGL>.
               super_RefCountedObject<Diligent::IRenderDeviceGL>.m_pRefCounters);
  }
  pcVar15 = (ObjDesc->super_DeviceObjectAttribs).Name;
  if (pcVar15 == (char *)0x0) {
    pIVar14 = GetStringAllocator();
    iVar12 = (**pIVar14->_vptr_IMemoryAllocator)
                       (pIVar14,0x13,"Object address string",
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceObjectBase.hpp"
                        ,0x55);
    pcVar15 = (char *)CONCAT44(extraout_var_00,iVar12);
    snprintf(pcVar15,0x13,"0x%llX",this);
  }
  else {
    sVar13 = strlen(pcVar15);
    pIVar14 = GetStringAllocator();
    iVar12 = (**pIVar14->_vptr_IMemoryAllocator)
                       (pIVar14,sVar13 + 1,"Object name copy",
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceObjectBase.hpp"
                        ,0x4e);
    pcVar15 = (char *)CONCAT44(extraout_var,iVar12);
    memcpy(pcVar15,(ObjDesc->super_DeviceObjectAttribs).Name,sVar13 + 1);
  }
  (this->m_Desc).super_DeviceObjectAttribs.Name = pcVar15;
  return;
}

Assistant:

DeviceObjectBase(IReferenceCounters*   pRefCounters,
                     RenderDeviceImplType* pDevice,
                     const ObjectDescType& ObjDesc,
                     bool                  bIsDeviceInternal = false) :
        // clang-format off
        TBase              {pRefCounters},
        m_pDevice          {pDevice          },
        m_Desc             {ObjDesc          },
        m_UniqueID         {pDevice != nullptr ? pDevice->GenerateUniqueId() : 0},
        m_bIsDeviceInternal{bIsDeviceInternal}
    //clang-format on
    {
        // Do not keep strong reference to the device if the object is an internal device object
        if (!m_bIsDeviceInternal)
        {
            // Device can be null if object is used for serialization
            VERIFY_EXPR(m_pDevice != nullptr);
            m_pDevice->AddRef();
        }

        if (ObjDesc.Name != nullptr)
        {
            size_t  size     = strlen(ObjDesc.Name) + 1;
            char* NameCopy = ALLOCATE(GetStringAllocator(), "Object name copy", char, size);
            memcpy(NameCopy, ObjDesc.Name, size);
            m_Desc.Name = NameCopy;
        }
        else
        {
            size_t size       = 16 + 2 + 1; // 0x12345678
            char*  AddressStr = ALLOCATE(GetStringAllocator(), "Object address string", char, size);
            snprintf(AddressStr, size, "0x%llX", static_cast<unsigned long long>(reinterpret_cast<size_t>(this)));
            m_Desc.Name = AddressStr;
        }

        //                        !!!WARNING!!!
        // We cannot add resource to the hash table from here, because the object
        // has not been completely created yet and the reference counters object
        // is not initialized!
        //m_pDevice->AddResourceToHash( this ); - ERROR!
    }